

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object.c
# Opt level: O3

object object_create(char *name,accessor_type_id accessor,object_impl impl,
                    object_impl_interface_singleton singleton,klass cls)

{
  int iVar1;
  object __ptr;
  size_t sVar2;
  char *__dest;
  object_interface poVar3;
  
  __ptr = (object)malloc(0x30);
  if (__ptr == (object)0x0) {
    return (object)0x0;
  }
  if (name == (char *)0x0) {
    __ptr->name = (char *)0x0;
  }
  else {
    sVar2 = strlen(name);
    __dest = (char *)malloc(sVar2 + 1);
    __ptr->name = __dest;
    if (__dest == (char *)0x0) {
      log_write_impl_va("metacall",0x44,"object_create",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_object.c"
                        ,3,"Invalid object name allocation <%s>",name);
      goto LAB_001084c2;
    }
    memcpy(__dest,name,sVar2 + 1);
  }
  __ptr->impl = impl;
  __ptr->accessor = accessor;
  LOCK();
  (__ptr->ref).count = 0;
  UNLOCK();
  if (singleton == (object_impl_interface_singleton)0x0) {
    __ptr->interface = (object_interface)0x0;
    __ptr->cls = cls;
  }
  else {
    poVar3 = (*singleton)();
    __ptr->interface = poVar3;
    __ptr->cls = cls;
    if (((poVar3 != (object_interface)0x0) && (poVar3->create != (object_impl_interface_create)0x0))
       && (iVar1 = (*poVar3->create)(__ptr,impl), iVar1 != 0)) {
      log_write_impl_va("metacall",0x5e,"object_create",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_object.c"
                        ,3,"Invalid object (%s) create callback <%p>",__ptr->name,
                        __ptr->interface->create);
      free(__ptr->name);
LAB_001084c2:
      free(__ptr);
      return (object)0x0;
    }
  }
  LOCK();
  object_stats.allocations = object_stats.allocations + 1;
  UNLOCK();
  return __ptr;
}

Assistant:

object object_create(const char *name, enum accessor_type_id accessor, object_impl impl, object_impl_interface_singleton singleton, klass cls)
{
	object obj = malloc(sizeof(struct object_type));

	if (obj == NULL)
	{
		return NULL;
	}

	if (name != NULL)
	{
		size_t obj_name_size = strlen(name) + 1;

		obj->name = malloc(sizeof(char) * obj_name_size);

		if (obj->name == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid object name allocation <%s>", name);

			free(obj);

			return NULL;
		}

		memcpy(obj->name, name, obj_name_size);
	}
	else
	{
		obj->name = NULL;
	}

	obj->impl = impl;
	obj->accessor = accessor;
	threading_atomic_ref_count_initialize(&obj->ref);

	obj->interface = singleton ? singleton() : NULL;

	obj->cls = cls;

	if (obj->interface != NULL && obj->interface->create != NULL)
	{
		if (obj->interface->create(obj, impl) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid object (%s) create callback <%p>", obj->name, obj->interface->create);

			free(obj->name);
			free(obj);

			return NULL;
		}
	}

	reflect_memory_tracker_allocation(object_stats);

	return obj;
}